

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::WriteCueTime(FILE *f,mkvtime_t time_ns)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  mkvtime_t hr;
  mkvtime_t min;
  mkvtime_t sec;
  mkvtime_t ms;
  mkvtime_t time_ns_local;
  FILE *f_local;
  
  lVar2 = (time_ns / 1000000) / 1000;
  lVar3 = lVar2 / 0x3c;
  lVar4 = lVar3 / 0x3c;
  if ((lVar4 < 1) || (iVar1 = fprintf((FILE *)f,"%02lld:",lVar4), -1 < iVar1)) {
    iVar1 = fprintf((FILE *)f,"%02lld:%02lld.%03lld",lVar3 % 0x3c,lVar2 % 0x3c,
                    (time_ns / 1000000) % 1000);
    if (iVar1 < 0) {
      f_local._7_1_ = false;
    }
    else {
      f_local._7_1_ = true;
    }
  }
  else {
    f_local._7_1_ = false;
  }
  return f_local._7_1_;
}

Assistant:

bool vttdemux::WriteCueTime(FILE* f, mkvtime_t time_ns) {
  mkvtime_t ms = time_ns / 1000000;  // WebVTT time has millisecond resolution

  mkvtime_t sec = ms / 1000;
  ms -= sec * 1000;

  mkvtime_t min = sec / 60;
  sec -= 60 * min;

  mkvtime_t hr = min / 60;
  min -= 60 * hr;

  if (hr > 0) {
    if (fprintf(f, "%02lld:", hr) < 0)
      return false;
  }

  if (fprintf(f, "%02lld:%02lld.%03lld", min, sec, ms) < 0)
    return false;

  return true;
}